

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O2

void __thiscall
dap::Chan<std::function<void_()>_>::put(Chan<std::function<void_()>_> *this,function<void_()> *in)

{
  bool bVar1;
  size_type sVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_38;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_38,&this->mutex);
  sVar2 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                    (&(this->queue).c);
  bVar1 = this->closed;
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue,in);
  if ((sVar2 == 0) && ((bVar1 & 1U) == 0)) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_38);
  return;
}

Assistant:

void Chan<T>::put(T&& in) {
  std::unique_lock<std::mutex> lock(mutex);
  auto notify = queue.size() == 0 && !closed;
  queue.push(std::move(in));
  if (notify) {
    cv.notify_all();
  }
}